

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O2

void __thiscall Farm::editBasket(Farm *this)

{
  double *pdVar1;
  double dVar2;
  vector<Basket,_std::allocator<Basket>_> *this_00;
  Farm *pFVar3;
  bool bVar4;
  iterator iVar5;
  ostream *poVar6;
  reference this_01;
  int iVar7;
  double *pdVar8;
  allocator local_bd;
  int nif;
  Basket b;
  double weight;
  int i;
  vector<Basket,_std::allocator<Basket>_> *local_88;
  Farm *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  std::__cxx11::string::string((string *)&b,"Enter client\'s nif: ",(allocator *)&weight);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&nif,(string *)&b,(function<bool_(int)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::__cxx11::string::~string((string *)&b);
  bVar4 = searchClientByNIF(this,nif);
  if (bVar4) {
    iVar5 = std::
            _Hashtable<int,_std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_std::allocator<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->baskets)._M_h,&nif);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::string::string
                ((string *)&b,"Client doesn\'t have any active baskets to delivery!",
                 (allocator *)&weight);
      cinERR((string *)&b);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::string((string *)&b,"ENTER to go back",(allocator *)&weight);
      enterWait((string *)&b);
    }
    else {
      local_80 = this;
      line(0x14,'-');
      poVar6 = std::operator<<((ostream *)&std::cout,"Client\'s baskets:");
      std::endl<char,std::char_traits<char>>(poVar6);
      line(0x14,'-');
      i = 0;
      local_88 = (vector<Basket,_std::allocator<Basket>_> *)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                        ._M_cur + 0x10);
      pdVar1 = *(double **)
                ((long)iVar5.
                       super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                       ._M_cur + 0x18);
      iVar7 = 1;
      for (pdVar8 = *(double **)
                     ((long)iVar5.
                            super__Node_iterator_base<std::pair<const_int,_std::vector<Basket,_std::allocator<Basket>_>_>,_false>
                            ._M_cur + 0x10); pdVar8 != pdVar1; pdVar8 = pdVar8 + 2) {
        b.weight = *pdVar8;
        b._8_8_ = pdVar8[1];
        i = iVar7;
        poVar6 = std::operator<<((ostream *)&std::cout,"ID: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar7);
        std::operator<<(poVar6," | Weight: ");
        dVar2 = Basket::getWeight(&b);
        poVar6 = std::ostream::_M_insert<double>(dVar2);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar7 = iVar7 + 1;
      }
      std::__cxx11::string::string
                ((string *)&b,"Enter ID of the basket to be edited: ",(allocator *)&weight);
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = &i;
      local_38 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                 ::_M_manager;
      getOption(&nif,(string *)&b,(function<bool_(int)> *)&local_50);
      pFVar3 = local_80;
      this_00 = local_88;
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      std::__cxx11::string::~string((string *)&b);
      std::__cxx11::string::string((string *)&b,"Enter basket\'s new weight: ",&local_bd);
      getDouble(&weight,(string *)&b);
      std::__cxx11::string::~string((string *)&b);
      this_01 = std::vector<Basket,_std::allocator<Basket>_>::at(this_00,(long)nif);
      Basket::setWeight(this_01,weight);
      pFVar3->clientsFileChanged = true;
      poVar6 = std::operator<<((ostream *)&std::cout,"Basket successfully edited!");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::string::string((string *)&b,"ENTER to go back",&local_bd);
      enterWait((string *)&b);
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&b,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!",
               (allocator *)&weight);
    cinERR((string *)&b);
    std::__cxx11::string::~string((string *)&b);
    std::__cxx11::string::string((string *)&b,"ENTER to go back",(allocator *)&weight);
    enterWait((string *)&b);
  }
  std::__cxx11::string::~string((string *)&b);
  return;
}

Assistant:

void Farm::editBasket() {
    int nif;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    const auto& cb_pair = baskets.find(nif);
    if(cb_pair == baskets.end()){
        cinERR("Client doesn't have any active baskets to delivery!");
        enterWait();
        return;
    }

    line(20);
    cout << "Client's baskets:" << endl;
    line(20);

    int i=0;
    for(Basket b: cb_pair->second){
        i++;
        cout << "ID: " << i << " | Weight: " << b.getWeight() << endl;
    }

    getOption(nif, "Enter ID of the basket to be edited: ", [&](int a){ return a > 0 && a < i; });

    double weight;
    getDouble(weight, "Enter basket's new weight: ");
    cb_pair->second.at(nif).setWeight(weight);

    clientsFileChanged = true;
    cout << "Basket successfully edited!" << endl;
    enterWait();
}